

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

void __thiscall soul::ASTVisitor::visitObject(ASTVisitor *this,ModuleBase *t)

{
  ObjectType OVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  string local_30;
  
  OVar1 = (t->super_ASTObject).objectType;
  if (OVar1 == Namespace) {
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[8];
  }
  else if (OVar1 == Processor) {
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[6];
  }
  else {
    if (OVar1 != Graph) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Unknown AST module","");
      throwInternalCompilerError(&local_30);
    }
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[7];
  }
  (*UNRECOVERED_JUMPTABLE)();
  return;
}

Assistant:

virtual void visitObject (AST::ModuleBase& t)
    {
        switch (t.objectType)
        {
            SOUL_AST_MODULES (SOUL_INVOKE_FOR_SUBCLASS)
            default: throwInternalCompilerError ("Unknown AST module"); break;
        }
    }